

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O0

void __thiscall WorkQueue<HTTPClosure>::WorkQueue(WorkQueue<HTTPClosure> *this,size_t _maxDepth)

{
  long lVar1;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
  *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffffb8);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x28));
  std::
  deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
  ::deque(in_stack_ffffffffffffffb8);
  *(undefined1 *)(in_RDI + 0xa8) = 1;
  *(undefined8 *)(in_RDI + 0xb0) = in_RSI;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit WorkQueue(size_t _maxDepth) : maxDepth(_maxDepth)
    {
    }